

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_enumerate_mutex_impls(int current_impl,int *next_impl,char **next_impl_name)

{
  int i;
  char **next_impl_name_local;
  int *next_impl_local;
  int current_impl_local;
  
  i = 0;
  while( true ) {
    if (2 < i) {
      return 0;
    }
    if (kmp_mutex_impl_info[i].id == current_impl) break;
    i = i + 1;
  }
  *next_impl = kmp_mutex_impl_info[i + 1].id;
  *next_impl_name = kmp_mutex_impl_info[i + 1].name;
  return 1;
}

Assistant:

OMPT_API_ROUTINE int ompt_enumerate_mutex_impls(int current_impl,
                                                int *next_impl,
                                                const char **next_impl_name) {
  const static int len =
      sizeof(kmp_mutex_impl_info) / sizeof(kmp_mutex_impl_info_t);
  int i = 0;
  for (i = 0; i < len - 1; i++) {
    if (kmp_mutex_impl_info[i].id != current_impl)
      continue;
    *next_impl = kmp_mutex_impl_info[i + 1].id;
    *next_impl_name = kmp_mutex_impl_info[i + 1].name;
    return 1;
  }
  return 0;
}